

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall
wallet::anon_unknown_48::FastWalletRescanFilter::AddScriptPubKeys
          (FastWalletRescanFilter *this,DescriptorScriptPubKeyMan *desc_spkm,int32_t last_range_end)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  long local_80;
  _Hash_node_base *local_78;
  _Hashtable<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_70;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  DescriptorScriptPubKeyMan::GetScriptPubKeys
            ((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
              *)&local_70,desc_spkm,last_range_end);
  for (; local_70._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      local_70._M_before_begin._M_nxt = (local_70._M_before_begin._M_nxt)->_M_nxt) {
    uVar1 = *(uint *)((long)&local_70._M_before_begin._M_nxt[4]._M_nxt + 4);
    uVar2 = uVar1 - 0x1d;
    local_78 = local_70._M_before_begin._M_nxt[1]._M_nxt;
    if (uVar1 < 0x1d) {
      uVar2 = uVar1;
      local_78 = local_70._M_before_begin._M_nxt + 1;
    }
    local_80 = (long)&local_78->_M_nxt + (long)(int)uVar2;
    std::
    _Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_emplace<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
              ((_Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->m_filter_set,&local_78,&local_80);
  }
  std::
  _Hashtable<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddScriptPubKeys(const DescriptorScriptPubKeyMan* desc_spkm, int32_t last_range_end = 0)
    {
        for (const auto& script_pub_key : desc_spkm->GetScriptPubKeys(last_range_end)) {
            m_filter_set.emplace(script_pub_key.begin(), script_pub_key.end());
        }
    }